

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O0

USTATUS __thiscall FfsParser::parseVolumeBody(FfsParser *this,UModelIndex *index)

{
  undefined8 index_00;
  bool bVar1;
  UINT8 UVar2;
  int32_t iVar3;
  uint uVar4;
  UINT32 UVar5;
  int32_t iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  unsigned_long *puVar11;
  USTATUS UVar12;
  TreeModel *pTVar13;
  char *pcVar14;
  EFI_GUID_ *v;
  EFI_GUID_ EVar15;
  undefined1 local_508 [8];
  UModelIndex current_2;
  undefined1 auStack_4e8 [4];
  int i_2;
  UINT8 local_4e0 [8];
  CBString local_4d8;
  CBString local_4c0;
  CBString local_4a8;
  UByteArray local_490;
  undefined1 local_470 [8];
  UByteArray anotherGuid;
  UModelIndex another;
  undefined1 local_430 [4];
  int j;
  undefined1 local_410 [8];
  UByteArray currentGuid;
  UModelIndex current_1;
  undefined1 local_3d0 [4];
  int i_1;
  CBString local_3b8;
  CBString local_3a0;
  UByteArray local_388;
  USTATUS local_368;
  USTATUS result;
  UModelIndex fileIndex;
  UModelIndex local_328;
  UByteArray local_310;
  UByteArray local_2f0;
  CBString local_2d0;
  CBString local_2b8;
  undefined1 local_2a0 [8];
  CBString info_1;
  UModelIndex local_268;
  UByteArray local_250;
  UByteArray local_230;
  CBString local_210;
  CBString local_1f8;
  undefined1 local_1e0 [8];
  CBString info;
  UByteArray free;
  UINT8 *current;
  UINT32 size;
  UINT32 i;
  UByteArray freeSpace;
  CBString local_160;
  char *local_148;
  VOLUME_PARSING_DATA *pdata_1;
  UByteArray data_1;
  unsigned_long local_118;
  undefined1 local_110 [8];
  UByteArray header;
  uint local_d0;
  UINT32 fileSize;
  UINT32 fileOffset;
  UINT32 volumeBodySize;
  char *local_b0;
  VOLUME_PARSING_DATA *pdata;
  UByteArray data;
  int local_80;
  byte local_7a;
  UINT8 revision;
  UINT32 usedSpace;
  UINT8 ffsVersion;
  UINT8 emptyByte;
  UByteArray local_68;
  int32_t local_44;
  undefined1 local_40 [4];
  UINT32 volumeHeaderSize;
  UByteArray volumeBody;
  UModelIndex *index_local;
  FfsParser *this_local;
  
  volumeBody.d.field_2._8_8_ = index;
  bVar1 = UModelIndex::isValid(index);
  if (bVar1) {
    TreeModel::body((UByteArray *)local_40,this->model,(UModelIndex *)volumeBody.d.field_2._8_8_);
    TreeModel::header(&local_68,this->model,(UModelIndex *)volumeBody.d.field_2._8_8_);
    iVar3 = UByteArray::size(&local_68);
    UByteArray::~UByteArray(&local_68);
    local_44 = iVar3;
    UVar2 = TreeModel::subtype(this->model,(UModelIndex *)volumeBody.d.field_2._8_8_);
    if (UVar2 == 'q') {
      this_local = (FfsParser *)
                   NvramParser::parseNvramVolumeBody
                             (this->nvramParser,(UModelIndex *)volumeBody.d.field_2._8_8_);
    }
    else {
      UVar2 = TreeModel::subtype(this->model,(UModelIndex *)volumeBody.d.field_2._8_8_);
      if (UVar2 == 'r') {
        this_local = (FfsParser *)
                     parseMicrocodeVolumeBody(this,(UModelIndex *)volumeBody.d.field_2._8_8_);
      }
      else {
        revision = 0xff;
        local_7a = 2;
        local_80 = 0;
        data.d.field_2._M_local_buf[0xf] = '\x02';
        bVar1 = TreeModel::hasEmptyParsingData
                          (this->model,(UModelIndex *)volumeBody.d.field_2._8_8_);
        if (!bVar1) {
          TreeModel::parsingData
                    ((UByteArray *)&pdata,this->model,(UModelIndex *)volumeBody.d.field_2._8_8_);
          local_b0 = UByteArray::constData((UByteArray *)&pdata);
          revision = local_b0[0x1a];
          local_7a = local_b0[0x19];
          local_80 = *(int *)(local_b0 + 0x14);
          data.d.field_2._M_local_buf[0xf] = local_b0[0x1b];
          UByteArray::~UByteArray((UByteArray *)&pdata);
        }
        if ((local_7a == 2) || (local_7a == 3)) {
          uVar4 = UByteArray::size((UByteArray *)local_40);
          local_d0 = 0;
          do {
            if (uVar4 <= local_d0) break;
            UVar5 = getFileSize(this,(UByteArray *)local_40,local_d0,local_7a,
                                data.d.field_2._M_local_buf[0xf]);
            if (UVar5 == 0) {
              usprintf((CBString *)((long)&header.d.field_2 + 8),
                       "%s: file header parsing failed with invalid size","parseVolumeBody");
              msg(this,(CBString *)((long)&header.d.field_2 + 8),
                  (UModelIndex *)volumeBody.d.field_2._8_8_);
              Bstrlib::CBString::~CBString((CBString *)((long)&header.d.field_2 + 8));
              break;
            }
            local_118 = 0x18;
            data_1.d.field_2._8_8_ = (ulong)uVar4 - (ulong)local_d0;
            puVar11 = std::min<unsigned_long>
                                (&local_118,(unsigned_long *)(data_1.d.field_2._M_local_buf + 8));
            UByteArray::mid((UByteArray *)local_110,(UByteArray *)local_40,local_d0,
                            (int32_t)*puVar11);
            iVar3 = UByteArray::count((UByteArray *)local_110,revision);
            iVar6 = UByteArray::size((UByteArray *)local_110);
            if (iVar3 == iVar6) {
              if (((local_80 != 0) && (local_80 == local_d0 + local_44)) &&
                 (bVar1 = TreeModel::hasEmptyParsingData
                                    (this->model,(UModelIndex *)volumeBody.d.field_2._8_8_), !bVar1)
                 ) {
                TreeModel::parsingData
                          ((UByteArray *)&pdata_1,this->model,
                           (UModelIndex *)volumeBody.d.field_2._8_8_);
                local_148 = UByteArray::data((UByteArray *)&pdata_1);
                local_148[0x18] = '\x01';
                TreeModel::setParsingData
                          (this->model,(UModelIndex *)volumeBody.d.field_2._8_8_,
                           (UByteArray *)&pdata_1);
                index_00 = volumeBody.d.field_2._8_8_;
                pTVar13 = this->model;
                TreeModel::text((CBString *)((long)&freeSpace.d.field_2 + 8),pTVar13,
                                (UModelIndex *)volumeBody.d.field_2._8_8_);
                Bstrlib::CBString::operator+
                          (&local_160,(CBString *)((long)&freeSpace.d.field_2 + 8),"UsedSpace ");
                TreeModel::setText(pTVar13,(UModelIndex *)index_00,&local_160);
                Bstrlib::CBString::~CBString(&local_160);
                Bstrlib::CBString::~CBString((CBString *)((long)&freeSpace.d.field_2 + 8));
                UByteArray::~UByteArray((UByteArray *)&pdata_1);
              }
              UByteArray::mid((UByteArray *)&size,(UByteArray *)local_40,local_d0,-1);
              iVar3 = UByteArray::count((UByteArray *)&size,revision);
              iVar6 = UByteArray::size((UByteArray *)&size);
              if (iVar3 == iVar6) {
                uVar7 = UByteArray::size((UByteArray *)&size);
                uVar8 = UByteArray::size((UByteArray *)&size);
                usprintf((CBString *)local_2a0,"Full size: %Xh (%u)",(ulong)uVar7,(ulong)uVar8);
                pTVar13 = this->model;
                UVar5 = local_44 + local_d0;
                Bstrlib::CBString::CBString(&local_2b8,"Volume free space");
                Bstrlib::CBString::CBString(&local_2d0);
                UByteArray::UByteArray(&local_2f0);
                UByteArray::UByteArray(&local_310);
                TreeModel::addItem(&local_328,pTVar13,UVar5,'D','\0',&local_2b8,&local_2d0,
                                   (CBString *)local_2a0,&local_2f0,(UByteArray *)&size,&local_310,
                                   Movable,(UModelIndex *)volumeBody.d.field_2._8_8_,'\0');
                UByteArray::~UByteArray(&local_310);
                UByteArray::~UByteArray(&local_2f0);
                Bstrlib::CBString::~CBString(&local_2d0);
                Bstrlib::CBString::~CBString(&local_2b8);
                Bstrlib::CBString::~CBString((CBString *)local_2a0);
              }
              else {
                uVar7 = UByteArray::size((UByteArray *)&size);
                free.d.field_2._8_8_ = UByteArray::constData((UByteArray *)&size);
                current._4_4_ = 0;
                while ((current._4_4_ < uVar7 && (*(UINT8 *)free.d.field_2._8_8_ == revision))) {
                  current._4_4_ = current._4_4_ + 1;
                  free.d.field_2._8_8_ = free.d.field_2._8_8_ + 1;
                }
                if (current._4_4_ != (current._4_4_ + 7 & 0xfffffff8)) {
                  current._4_4_ = (current._4_4_ + 7 & 0xfffffff8) - 8;
                }
                if (current._4_4_ != 0) {
                  UByteArray::left((UByteArray *)&info.super_tagbstring.data,(UByteArray *)&size,
                                   current._4_4_);
                  uVar7 = UByteArray::size((UByteArray *)&info.super_tagbstring.data);
                  uVar8 = UByteArray::size((UByteArray *)&info.super_tagbstring.data);
                  usprintf((CBString *)local_1e0,"Full size: %Xh (%u)",(ulong)uVar7,(ulong)uVar8);
                  pTVar13 = this->model;
                  UVar5 = local_44 + local_d0;
                  Bstrlib::CBString::CBString(&local_1f8,"Volume free space");
                  Bstrlib::CBString::CBString(&local_210);
                  UByteArray::UByteArray(&local_230);
                  UByteArray::UByteArray(&local_250);
                  TreeModel::addItem(&local_268,pTVar13,UVar5,'D','\0',&local_1f8,&local_210,
                                     (CBString *)local_1e0,&local_230,
                                     (UByteArray *)&info.super_tagbstring.data,&local_250,Movable,
                                     (UModelIndex *)volumeBody.d.field_2._8_8_,'\0');
                  UByteArray::~UByteArray(&local_250);
                  UByteArray::~UByteArray(&local_230);
                  Bstrlib::CBString::~CBString(&local_210);
                  Bstrlib::CBString::~CBString(&local_1f8);
                  Bstrlib::CBString::~CBString((CBString *)local_1e0);
                  UByteArray::~UByteArray((UByteArray *)&info.super_tagbstring.data);
                }
                UByteArray::mid((UByteArray *)&info_1.super_tagbstring.data,(UByteArray *)&size,
                                current._4_4_,-1);
                parseVolumeNonUefiData
                          (this,(UByteArray *)&info_1.super_tagbstring.data,
                           local_44 + local_d0 + current._4_4_,
                           (UModelIndex *)volumeBody.d.field_2._8_8_);
                UByteArray::~UByteArray((UByteArray *)&info_1.super_tagbstring.data);
              }
              usedSpace = 3;
              UByteArray::~UByteArray((UByteArray *)&size);
            }
            else if ((uVar4 - local_d0 < 0x18) || (uVar4 - local_d0 < UVar5)) {
              UByteArray::mid((UByteArray *)&fileIndex.m,(UByteArray *)local_40,local_d0,-1);
              parseVolumeNonUefiData
                        (this,(UByteArray *)&fileIndex.m,local_44 + local_d0,
                         (UModelIndex *)volumeBody.d.field_2._8_8_);
              UByteArray::~UByteArray((UByteArray *)&fileIndex.m);
              usedSpace = 3;
            }
            else {
              UModelIndex::UModelIndex((UModelIndex *)&result);
              UByteArray::mid(&local_388,(UByteArray *)local_40,local_d0,UVar5);
              UVar12 = parseFileHeader(this,&local_388,local_44 + local_d0,
                                       (UModelIndex *)volumeBody.d.field_2._8_8_,
                                       (UModelIndex *)&result);
              UByteArray::~UByteArray(&local_388);
              local_368 = UVar12;
              if (UVar12 != 0) {
                usprintf(&local_3b8,"%s: file header parsing failed with error ","parseVolumeBody");
                errorCodeToUString((CBString *)local_3d0,local_368);
                Bstrlib::CBString::operator+(&local_3a0,&local_3b8,(CBString *)local_3d0);
                msg(this,&local_3a0,(UModelIndex *)volumeBody.d.field_2._8_8_);
                Bstrlib::CBString::~CBString(&local_3a0);
                Bstrlib::CBString::~CBString((CBString *)local_3d0);
                Bstrlib::CBString::~CBString(&local_3b8);
              }
              local_d0 = UVar5 + local_d0 + 7 & 0xfffffff8;
              usedSpace = 0;
            }
            UByteArray::~UByteArray((UByteArray *)local_110);
          } while (usedSpace == 0);
          current_1.m._4_4_ = 0;
          while( true ) {
            iVar9 = TreeModel::rowCount(this->model,(UModelIndex *)volumeBody.d.field_2._8_8_);
            if (iVar9 <= current_1.m._4_4_) break;
            pTVar13 = UModelIndex::model((UModelIndex *)volumeBody.d.field_2._8_8_);
            TreeModel::index((TreeModel *)((long)&currentGuid.d.field_2 + 8),(char *)pTVar13,
                             current_1.m._4_4_);
            UVar2 = TreeModel::type(this->model,(UModelIndex *)((long)&currentGuid.d.field_2 + 8));
            if (UVar2 == 'B') {
              UVar2 = TreeModel::subtype(this->model,
                                         (UModelIndex *)((long)&currentGuid.d.field_2 + 8));
              if (UVar2 != 0xf0) {
                TreeModel::header((UByteArray *)local_430,this->model,
                                  (UModelIndex *)((long)&currentGuid.d.field_2 + 8));
                pcVar14 = UByteArray::constData((UByteArray *)local_430);
                UByteArray::UByteArray((UByteArray *)local_410,pcVar14,0x10);
                UByteArray::~UByteArray((UByteArray *)local_430);
                another.m._4_4_ = current_1.m._4_4_;
                while( true ) {
                  another.m._4_4_ = another.m._4_4_ + 1;
                  iVar9 = TreeModel::rowCount(this->model,(UModelIndex *)volumeBody.d.field_2._8_8_)
                  ;
                  if (iVar9 <= another.m._4_4_) break;
                  pTVar13 = UModelIndex::model((UModelIndex *)volumeBody.d.field_2._8_8_);
                  TreeModel::index((TreeModel *)((long)&anotherGuid.d.field_2 + 8),(char *)pTVar13,
                                   another.m._4_4_);
                  UVar2 = TreeModel::type(this->model,
                                          (UModelIndex *)((long)&anotherGuid.d.field_2 + 8));
                  if (UVar2 == 'B') {
                    TreeModel::header(&local_490,this->model,
                                      (UModelIndex *)((long)&anotherGuid.d.field_2 + 8));
                    pcVar14 = UByteArray::constData(&local_490);
                    UByteArray::UByteArray((UByteArray *)local_470,pcVar14,0x10);
                    UByteArray::~UByteArray(&local_490);
                    bVar1 = UByteArray::operator==((UByteArray *)local_410,(UByteArray *)local_470);
                    if (bVar1) {
                      usprintf(&local_4c0,"%s: file with duplicate GUID ","parseVolumeBody");
                      v = (EFI_GUID_ *)UByteArray::data((UByteArray *)local_470);
                      EVar15 = readUnaligned<EFI_GUID_>(v);
                      _auStack_4e8 = EVar15;
                      guidToUString(&local_4d8,(EFI_GUID *)auStack_4e8,true);
                      Bstrlib::CBString::operator+(&local_4a8,&local_4c0,&local_4d8);
                      msg(this,&local_4a8,(UModelIndex *)((long)&anotherGuid.d.field_2 + 8));
                      Bstrlib::CBString::~CBString(&local_4a8);
                      Bstrlib::CBString::~CBString(&local_4d8);
                      Bstrlib::CBString::~CBString(&local_4c0);
                    }
                    UByteArray::~UByteArray((UByteArray *)local_470);
                  }
                }
                UByteArray::~UByteArray((UByteArray *)local_410);
              }
            }
            current_1.m._4_4_ = current_1.m._4_4_ + 1;
          }
          current_2.m._4_4_ = 0;
          while( true ) {
            iVar9 = current_2.m._4_4_;
            iVar10 = TreeModel::rowCount(this->model,(UModelIndex *)volumeBody.d.field_2._8_8_);
            if (iVar10 <= iVar9) break;
            pTVar13 = UModelIndex::model((UModelIndex *)volumeBody.d.field_2._8_8_);
            TreeModel::index((TreeModel *)local_508,(char *)pTVar13,current_2.m._4_4_);
            UVar2 = TreeModel::type(this->model,(UModelIndex *)local_508);
            if (UVar2 != '@') {
              if (UVar2 == 'B') {
                parseFileBody(this,(UModelIndex *)local_508);
              }
              else if (UVar2 != 'D') {
                this_local = (FfsParser *)0x9;
                goto LAB_001291a0;
              }
            }
            current_2.m._4_4_ = current_2.m._4_4_ + 1;
          }
          this_local = (FfsParser *)0x0;
        }
        else {
          usprintf((CBString *)&fileOffset,"%s: unknown FFS version %d","parseVolumeBody",
                   (ulong)local_7a);
          msg(this,(CBString *)&fileOffset,(UModelIndex *)volumeBody.d.field_2._8_8_);
          Bstrlib::CBString::~CBString((CBString *)&fileOffset);
          this_local = (FfsParser *)0x0;
        }
      }
    }
LAB_001291a0:
    UByteArray::~UByteArray((UByteArray *)local_40);
  }
  else {
    this_local = (FfsParser *)0x1;
  }
  return (USTATUS)this_local;
}

Assistant:

USTATUS FfsParser::parseVolumeBody(const UModelIndex & index)
{
    // Sanity check
    if (!index.isValid()) {
        return U_INVALID_PARAMETER;
    }
    
    // Get volume header size and body
    UByteArray volumeBody = model->body(index);
    UINT32 volumeHeaderSize = (UINT32)model->header(index).size();
    
    // Parse NVRAM volume with a dedicated function
    if (model->subtype(index) == Subtypes::NvramVolume) {
        return nvramParser->parseNvramVolumeBody(index);
    }
    
    // Parse Microcode volume with a dedicated function
    if (model->subtype(index) == Subtypes::MicrocodeVolume) {
        return parseMicrocodeVolumeBody(index);
    }
    
    // Get required values from parsing data
    UINT8 emptyByte = 0xFF;
    UINT8 ffsVersion = 2;
    UINT32 usedSpace = 0;
    UINT8 revision = 2;
    if (model->hasEmptyParsingData(index) == false) {
        UByteArray data = model->parsingData(index);
        const VOLUME_PARSING_DATA* pdata = (const VOLUME_PARSING_DATA*)data.constData();
        emptyByte = pdata->emptyByte;
        ffsVersion = pdata->ffsVersion;
        usedSpace = pdata->usedSpace;
        revision = pdata->revision;
    }
    
    // Check for unknown FFS version
    if (ffsVersion != 2 && ffsVersion != 3) {
        msg(usprintf("%s: unknown FFS version %d", __FUNCTION__, ffsVersion), index);
        return U_SUCCESS;
    }
    
    // Search for and parse all files
    UINT32 volumeBodySize = (UINT32)volumeBody.size();
    UINT32 fileOffset = 0;
    
    while (fileOffset < volumeBodySize) {
        UINT32 fileSize = getFileSize(volumeBody, fileOffset, ffsVersion, revision);
        
        if (fileSize == 0) {
            msg(usprintf("%s: file header parsing failed with invalid size", __FUNCTION__), index);
            break; // Exit from parsing loop
        }
        
        // Check that we are at the empty space
        UByteArray header = volumeBody.mid(fileOffset, (int)std::min(sizeof(EFI_FFS_FILE_HEADER), (size_t)volumeBodySize - fileOffset));
        if (header.count(emptyByte) == header.size()) { //Empty space
            // Check volume usedSpace entry to be valid
            if (usedSpace > 0 && usedSpace == fileOffset + volumeHeaderSize) {
                if (model->hasEmptyParsingData(index) == false) {
                    UByteArray data = model->parsingData(index);
                    VOLUME_PARSING_DATA* pdata = (VOLUME_PARSING_DATA*)data.data();
                    pdata->hasValidUsedSpace = TRUE;
                    model->setParsingData(index, data);
                    model->setText(index, model->text(index) + "UsedSpace ");
                }
            }
            
            // Check free space to be actually free
            UByteArray freeSpace = volumeBody.mid(fileOffset);
            if (freeSpace.count(emptyByte) != freeSpace.size()) {
                // Search for the first non-empty byte
                UINT32 i;
                UINT32 size = (UINT32)freeSpace.size();
                const UINT8* current = (UINT8*)freeSpace.constData();
                for (i = 0; i < size; i++) {
                    if (*current++ != emptyByte) {
                        break; // Exit from parsing loop
                    }
                }
                
                // Align found index to file alignment
                // It must be possible because minimum 16 bytes of empty were found before
                if (i != ALIGN8(i)) {
                    i = ALIGN8(i) - 8;
                }
                
                // Add all bytes before as free space
                if (i > 0) {
                    UByteArray free = freeSpace.left(i);
                    
                    // Get info
                    UString info = usprintf("Full size: %Xh (%u)", (UINT32)free.size(), (UINT32)free.size());
                    
                    // Add free space item
                    model->addItem(volumeHeaderSize + fileOffset, Types::FreeSpace, 0, UString("Volume free space"), UString(), info, UByteArray(), free, UByteArray(), Movable, index);
                }
                
                // Parse non-UEFI data
                parseVolumeNonUefiData(freeSpace.mid(i), volumeHeaderSize + fileOffset + i, index);
            }
            else {
                // Get info
                UString info = usprintf("Full size: %Xh (%u)", (UINT32)freeSpace.size(), (UINT32)freeSpace.size());
                
                // Add free space item
                model->addItem(volumeHeaderSize + fileOffset, Types::FreeSpace, 0, UString("Volume free space"), UString(), info, UByteArray(), freeSpace, UByteArray(), Movable, index);
            }
            
            break; // Exit from parsing loop
        }
        
        // We aren't at the end of empty space
        // Check that the remaining space can still have a file in it
        if (volumeBodySize - fileOffset < sizeof(EFI_FFS_FILE_HEADER) // Remaining space is smaller than the smallest possible file
            || volumeBodySize - fileOffset < fileSize) { // Remaining space is smaller than non-empty file size
            // Parse non-UEFI data
            parseVolumeNonUefiData(volumeBody.mid(fileOffset), volumeHeaderSize + fileOffset, index);
            
            break; // Exit from parsing loop
        }
        
        // Parse current file's header
        UModelIndex fileIndex;
        USTATUS result = parseFileHeader(volumeBody.mid(fileOffset, fileSize), volumeHeaderSize + fileOffset, index, fileIndex);
        if (result) {
            msg(usprintf("%s: file header parsing failed with error ", __FUNCTION__) + errorCodeToUString(result), index);
        }
        
        // Move to next file
        fileOffset += fileSize;
        // TODO: check that alignment bytes are all of erase polarity bit, warn if not so
        fileOffset = ALIGN8(fileOffset);
    }
    
    // Check for duplicate GUIDs
    for (int i = 0; i < model->rowCount(index); i++) {
        UModelIndex current = index.model()->index(i, 0, index);
        
        // Skip non-file entries and padding files
        if (model->type(current) != Types::File
            || model->subtype(current) == EFI_FV_FILETYPE_PAD) {
            continue;
        }
        
        // Get current file GUID
        UByteArray currentGuid(model->header(current).constData(), sizeof(EFI_GUID));
        
        // Check files after current for having an equal GUID
        for (int j = i + 1; j < model->rowCount(index); j++) {
            UModelIndex another = index.model()->index(j, 0, index);
            
            // Skip non-file entries
            if (model->type(another) != Types::File) {
                continue;
            }
            
            // Get another file GUID
            UByteArray anotherGuid(model->header(another).constData(), sizeof(EFI_GUID));
            
            // Check GUIDs for being equal
            if (currentGuid == anotherGuid) {
                msg(usprintf("%s: file with duplicate GUID ", __FUNCTION__) + guidToUString(readUnaligned((EFI_GUID*)(anotherGuid.data()))), another);
            }
        }
    }
    
    // Parse bodies
    for (int i = 0; i < model->rowCount(index); i++) {
        UModelIndex current = index.model()->index(i, 0, index);
        
        switch (model->type(current)) {
            case Types::File:
                parseFileBody(current);
                break;
            case Types::Padding:
            case Types::FreeSpace:
                // No parsing required
                break;
            default:
                return U_UNKNOWN_ITEM_TYPE;
        }
    }
    
    return U_SUCCESS;
}